

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

void __thiscall uWS::Group<false>::removeWebSocket(Group<false> *this,uv_poll_t *webSocket)

{
  void *pvVar1;
  uv_poll_t *puVar2;
  size_type sVar3;
  _Elt_pointer ppuVar4;
  uv_poll_t *puVar5;
  
  pvVar1 = webSocket->data;
  sVar3 = std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>::size(&(this->iterators).c);
  if (sVar3 != 0) {
    ppuVar4 = (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppuVar4 ==
        (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppuVar4 = (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppuVar4[-1] = *(uv_poll_s **)((long)pvVar1 + 0x30);
  }
  puVar5 = *(uv_poll_t **)((long)pvVar1 + 0x30);
  puVar2 = *(uv_poll_t **)((long)pvVar1 + 0x38);
  if (puVar2 == puVar5) {
    this->webSocketHead = (uv_poll_t *)0x0;
  }
  else {
    if (puVar2 == (uv_poll_t *)0x0) {
      this->webSocketHead = puVar5;
    }
    else {
      *(uv_poll_t **)((long)puVar2->data + 0x30) = puVar5;
      puVar5 = *(uv_poll_t **)((long)pvVar1 + 0x30);
    }
    if (puVar5 != (uv_poll_t *)0x0) {
      *(uv_poll_t **)((long)puVar5->data + 0x38) = puVar2;
    }
  }
  return;
}

Assistant:

void Group<isServer>::removeWebSocket(uv_poll_t *webSocket) {
    uS::SocketData *socketData = (uS::SocketData *) webSocket->data;
    if (iterators.size()) {
        iterators.top() = socketData->next;
    }
    if (socketData->prev == socketData->next) {
        webSocketHead = (uv_poll_t *) nullptr;
    } else {
        if (socketData->prev) {
            ((uS::SocketData *) socketData->prev->data)->next = socketData->next;
        } else {
            webSocketHead = socketData->next;
        }
        if (socketData->next) {
            ((uS::SocketData *) socketData->next->data)->prev = socketData->prev;
        }
    }
}